

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O3

void __thiscall
mapbox::detail::Earcut<unsigned_int>::earcutLinked(Earcut<unsigned_int> *this,Node *ear,int pass)

{
  Node *pNVar1;
  Node *start;
  bool bVar2;
  uint *puVar3;
  Node *pNVar4;
  iterator iVar5;
  
  if (ear != (Node *)0x0) {
    do {
      pNVar4 = ear;
      if ((pass == 0) && (this->hashing == true)) {
        indexCurve(this,ear);
      }
      do {
        while( true ) {
          pNVar1 = ear->prev;
          start = ear->next;
          if (pNVar1 == start) {
            return;
          }
          if (this->hashing == true) {
            bVar2 = isEarHashed(this,ear);
          }
          else {
            bVar2 = isEar(this,ear);
          }
          if (bVar2 == false) break;
          iVar5._M_current =
               (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          puVar3 = (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          if (iVar5._M_current == puVar3) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar5,&pNVar1->i);
            iVar5._M_current =
                 (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            puVar3 = (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar5._M_current = pNVar1->i;
            iVar5._M_current = iVar5._M_current + 1;
            (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current;
          }
          if (iVar5._M_current == puVar3) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar5,&ear->i);
            iVar5._M_current =
                 (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            puVar3 = (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *iVar5._M_current = ear->i;
            iVar5._M_current = iVar5._M_current + 1;
            (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current;
          }
          if (iVar5._M_current == puVar3) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,iVar5,&start->i);
          }
          else {
            *iVar5._M_current = start->i;
            (this->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          pNVar4 = ear->prev;
          pNVar1 = ear->next;
          pNVar1->prev = pNVar4;
          pNVar4->next = pNVar1;
          pNVar4 = ear->prevZ;
          pNVar1 = ear->nextZ;
          if (pNVar4 != (Node *)0x0) {
            pNVar4->nextZ = pNVar1;
          }
          if (pNVar1 != (Node *)0x0) {
            pNVar1->prevZ = pNVar4;
          }
          ear = start->next;
          pNVar4 = ear;
        }
        ear = start;
      } while (start != pNVar4);
      if (pass == 0) {
        ear = filterPoints(this,start,(Node *)0x0);
        pass = 1;
      }
      else {
        if (pass != 1) {
          if (pass != 2) {
            return;
          }
          splitEarcut(this,start);
          return;
        }
        pNVar4 = filterPoints(this,start,(Node *)0x0);
        ear = cureLocalIntersections(this,pNVar4);
        pass = 2;
      }
    } while (ear != (Node *)0x0);
  }
  return;
}

Assistant:

void Earcut<N>::earcutLinked(Node* ear, int pass) {
    if (!ear) return;

    // interlink polygon nodes in z-order
    if (!pass && hashing) indexCurve(ear);

    Node* stop = ear;
    Node* prev;
    Node* next;

    int iterations = 0;

    // iterate through ears, slicing them one by one
    while (ear->prev != ear->next) {
        iterations++;
        prev = ear->prev;
        next = ear->next;

        if (hashing ? isEarHashed(ear) : isEar(ear)) {
            // cut off the triangle
            indices.emplace_back(prev->i);
            indices.emplace_back(ear->i);
            indices.emplace_back(next->i);

            removeNode(ear);

            // skipping the next vertice leads to less sliver triangles
            ear = next->next;
            stop = next->next;

            continue;
        }

        ear = next;

        // if we looped through the whole remaining polygon and can't find any more ears
        if (ear == stop) {
            // try filtering points and slicing again
            if (!pass) earcutLinked(filterPoints(ear), 1);

            // if this didn't work, try curing all small self-intersections locally
            else if (pass == 1) {
                ear = cureLocalIntersections(filterPoints(ear));
                earcutLinked(ear, 2);

            // as a last resort, try splitting the remaining polygon into two
            } else if (pass == 2) splitEarcut(ear);

            break;
        }
    }
}